

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

void __thiscall
Diligent::BlendOperationToVkBlendOp::BlendOperationToVkBlendOp(BlendOperationToVkBlendOp *this)

{
  reference pvVar1;
  BlendOperationToVkBlendOp *this_local;
  
  memset(this,0,0x18);
  pvVar1 = std::array<VkBlendOp,_6UL>::operator[](&this->m_Map,1);
  *pvVar1 = VK_BLEND_OP_ADD;
  pvVar1 = std::array<VkBlendOp,_6UL>::operator[](&this->m_Map,2);
  *pvVar1 = VK_BLEND_OP_SUBTRACT;
  pvVar1 = std::array<VkBlendOp,_6UL>::operator[](&this->m_Map,3);
  *pvVar1 = VK_BLEND_OP_REVERSE_SUBTRACT;
  pvVar1 = std::array<VkBlendOp,_6UL>::operator[](&this->m_Map,4);
  *pvVar1 = VK_BLEND_OP_MIN;
  pvVar1 = std::array<VkBlendOp,_6UL>::operator[](&this->m_Map,5);
  *pvVar1 = VK_BLEND_OP_MAX;
  return;
}

Assistant:

BlendOperationToVkBlendOp()
    {
        m_Map[BLEND_OPERATION_ADD]          = VK_BLEND_OP_ADD;
        m_Map[BLEND_OPERATION_SUBTRACT]     = VK_BLEND_OP_SUBTRACT;
        m_Map[BLEND_OPERATION_REV_SUBTRACT] = VK_BLEND_OP_REVERSE_SUBTRACT;
        m_Map[BLEND_OPERATION_MIN]          = VK_BLEND_OP_MIN;
        m_Map[BLEND_OPERATION_MAX]          = VK_BLEND_OP_MAX;
    }